

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

MatchInfoCollection * __thiscall
icu_63::TZDBTimeZoneNames::find
          (TZDBTimeZoneNames *this,UnicodeString *text,int32_t start,uint32_t types,
          UErrorCode *status)

{
  TZDBNameSearchHandler handler;
  TextTrieMapSearchResultHandler local_50;
  uint32_t local_48;
  undefined4 local_44;
  MatchInfoCollection *local_40;
  char *local_38;
  
  umtx_initOnce((UInitOnce *)&gTZDBNamesTrieInitOnce,prepareFind,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_50._vptr_TextTrieMapSearchResultHandler = (_func_int **)&PTR_handleMatch_00399320;
    local_44 = 0;
    local_40 = (MatchInfoCollection *)0x0;
    local_38 = this->fRegion;
    local_48 = types;
    TextTrieMap::search(gTZDBNamesTrie,text,start,&local_50,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      return local_40;
    }
    local_50._vptr_TextTrieMapSearchResultHandler = (_func_int **)&PTR_handleMatch_00399320;
    if (local_40 != (MatchInfoCollection *)0x0) {
      (*local_40->_vptr_MatchInfoCollection[1])(local_40);
    }
  }
  return (MatchInfoCollection *)0x0;
}

Assistant:

TZDBTimeZoneNames::MatchInfoCollection*
TZDBTimeZoneNames::find(const UnicodeString& text, int32_t start, uint32_t types, UErrorCode& status) const {
    umtx_initOnce(gTZDBNamesTrieInitOnce, &prepareFind, status);
    if (U_FAILURE(status)) {
        return NULL;
    }

    TZDBNameSearchHandler handler(types, fRegion);
    gTZDBNamesTrie->search(text, start, (TextTrieMapSearchResultHandler *)&handler, status);
    if (U_FAILURE(status)) {
        return NULL;
    }
    int32_t maxLen = 0;
    return handler.getMatches(maxLen);
}